

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall DWallScrollInterpolation::Destroy(DWallScrollInterpolation *this)

{
  if (this->side != (side_t *)0x0) {
    this->side->textures[this->part].interpolation.field_0.p = (DInterpolation *)0x0;
    this->side = (side_t *)0x0;
    DInterpolation::Destroy(&this->super_DInterpolation);
    return;
  }
  FInterpolator::RemoveInterpolation(&interpolator,&this->super_DInterpolation);
  (this->super_DInterpolation).refcount = 0;
  DObject::Destroy((DObject *)this);
  return;
}

Assistant:

void DWallScrollInterpolation::Destroy()
{
	if (side != nullptr)
	{
		side->textures[part].interpolation = nullptr;
		side = nullptr;
	}
	Super::Destroy();
}